

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O1

void Bac_ManWriteBlifArray(FILE *pFile,Bac_Ntk_t *p,Vec_Int_t *vFanins,int iObj)

{
  char *pcVar1;
  long lVar2;
  
  if (0 < vFanins->nSize) {
    lVar2 = 0;
    do {
      pcVar1 = Bac_ObjNameStr(p,vFanins->pArray[lVar2]);
      fprintf((FILE *)pFile," %s",pcVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < vFanins->nSize);
  }
  if (-1 < iObj) {
    pcVar1 = Bac_ObjNameStr(p,iObj);
    fprintf((FILE *)pFile," %s",pcVar1);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Bac_ManWriteBlifArray( FILE * pFile, Bac_Ntk_t * p, Vec_Int_t * vFanins, int iObj )
{
    int iFanin, i;
    Vec_IntForEachEntry( vFanins, iFanin, i )
        fprintf( pFile, " %s", Bac_ObjNameStr(p, iFanin) );
    if ( iObj >= 0 )
        fprintf( pFile, " %s", Bac_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );
}